

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
argument_loader<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
::load_impl_sequence<0ul,1ul,2ul,3ul>
          (argument_loader<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
           *this,long call)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  bVar2 = type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>::load
                    ((type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void> *)(this + 0x48),
                     (PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  uStack_18._0_5_ = CONCAT14(bVar2,(undefined4)uStack_18);
  bVar2 = type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>::load
                    ((type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void> *)(this + 0x30),
                     *(PyObject **)(*(long *)(call + 8) + 8),
                     SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  uStack_18._0_6_ = CONCAT15(bVar2,(undefined5)uStack_18);
  bVar2 = type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>::load
                    ((type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void> *)(this + 0x18),
                     *(PyObject **)(*(long *)(call + 8) + 0x10),
                     SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  uStack_18._0_7_ = CONCAT16(bVar2,(undefined6)uStack_18);
  type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>::load
            ((type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void> *)this,
             *(PyObject **)(*(long *)(call + 8) + 0x18),SUB41((**(uint **)(call + 0x20) & 8) >> 3,0)
            );
  if ((char)((ulong)uStack_18 >> 0x20) == '\x01') {
    lVar3 = 1;
    do {
      bVar2 = lVar3 == 4;
      if (bVar2) {
        return bVar2;
      }
      lVar1 = lVar3 + 4;
      lVar3 = lVar3 + 1;
    } while (*(char *)((long)&uStack_18 + lVar1) != '\0');
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }